

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

void __thiscall Imf_3_4::IDManifest::IDManifest(IDManifest *this,CompressedIDManifest *compressed)

{
  int iVar1;
  InputExc *this_00;
  size_t outSize;
  vector<char,_std::allocator<char>_> uncomp;
  
  (this->_manifest).
  super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manifest).
  super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manifest).
  super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::vector
            (&uncomp,compressed->_uncompressedDataSize,(allocator_type *)&outSize);
  iVar1 = exr_uncompress_buffer
                    (0,compressed->_data,(long)compressed->_compressedDataSize,
                     uncomp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,compressed->_uncompressedDataSize,&outSize);
  if (iVar1 == 0) {
    if (outSize == compressed->_uncompressedDataSize) {
      init(this,(EVP_PKEY_CTX *)
                uncomp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&uncomp.super__Vector_base<char,_std::allocator<char>_>);
      return;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc
              (this_00,"IDManifest decompression (zlib) failed: mismatch in decompressed data size")
    ;
  }
  else {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"IDManifest decompression (zlib) failed.");
  }
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

IDManifest::IDManifest (const CompressedIDManifest& compressed)
{
    //
    // decompress the compressed manifest
    //

    vector<char> uncomp (compressed._uncompressedDataSize);
    size_t       outSize;
    size_t       inSize = static_cast<size_t> (compressed._compressedDataSize);
    if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                               nullptr,
                               compressed._data,
                               inSize,
                               uncomp.data (),
                               compressed._uncompressedDataSize,
                               &outSize))
    {
        throw IEX_NAMESPACE::InputExc (
            "IDManifest decompression (zlib) failed.");
    }
    if (outSize != compressed._uncompressedDataSize)
    {
        throw IEX_NAMESPACE::InputExc (
            "IDManifest decompression (zlib) failed: mismatch in decompressed data size");
    }

    init ((const char*) &uncomp[0], (const char*) &uncomp[0] + outSize);
}